

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdstore.cc
# Opt level: O0

int __thiscall bdStore::getPeer(bdStore *this,bdPeer *peer)

{
  bool bVar1;
  reference __src;
  _Self local_30;
  _List_iterator<bdPeer> local_28;
  iterator it;
  bdPeer *peer_local;
  bdStore *this_local;
  
  it._M_node = (_List_node_base *)peer;
  local_28._M_node =
       (_List_node_base *)std::__cxx11::list<bdPeer,_std::allocator<bdPeer>_>::begin(&this->store);
  std::advance<std::_List_iterator<bdPeer>,int>(&local_28,this->mIndex);
  local_30._M_node =
       (_List_node_base *)std::__cxx11::list<bdPeer,_std::allocator<bdPeer>_>::end(&this->store);
  bVar1 = std::operator!=(&local_28,&local_30);
  if (bVar1) {
    __src = std::_List_iterator<bdPeer>::operator*(&local_28);
    memcpy(it._M_node,__src,0x44);
    this->mIndex = this->mIndex + 1;
  }
  this_local._4_4_ = (uint)bVar1;
  return this_local._4_4_;
}

Assistant:

int bdStore::getPeer(bdPeer *peer) {
#ifdef DEBUG_STORE
	fprintf(stderr, "bdStore::getPeer() %ld Peers left\n", (long) store.size());
#endif

    std::list<bdPeer>::iterator it = store.begin();
    std::advance(it, mIndex);
	if (it != store.end()) {
		*peer = *it;
		mIndex++;
		return 1;
	}
	return 0;
}